

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void __thiscall phosg::io_error::io_error(io_error *this,int fd,string *what)

{
  char *pcVar1;
  string local_40;
  string *local_20;
  string *what_local;
  io_error *piStack_10;
  int fd_local;
  io_error *this_local;
  
  local_20 = what;
  what_local._4_4_ = fd;
  piStack_10 = this;
  pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)what);
  string_printf_abi_cxx11_(&local_40,"io error on fd %d: %s",(ulong)(uint)fd,pcVar1);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  this->_vptr_io_error = (_func_int **)0x150b28;
  *(undefined8 *)&this->field_0x10 = 0x150b58;
  this->error = -1;
  return;
}

Assistant:

io_error::io_error(int fd, const string& what)
    : runtime_error(string_printf("io error on fd %d: %s", fd, what.c_str())),
      error(-1) {}